

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# NeuralNetwork.pb.cc
# Opt level: O2

void __thiscall
CoreML::Specification::LoopLayerParams::LoopLayerParams(LoopLayerParams *this,LoopLayerParams *from)

{
  void *pvVar1;
  ArenaStringPtr value;
  NeuralNetwork *pNVar2;
  NeuralNetwork *pNVar3;
  
  (this->super_MessageLite)._vptr_MessageLite = (_func_int **)&PTR__LoopLayerParams_00394f90;
  (this->_internal_metadata_).
  super_InternalMetadataWithArenaBase<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_google::protobuf::internal::InternalMetadataWithArenaLite>
  .ptr_ = (void *)0x0;
  this->_cached_size_ = 0;
  pvVar1 = (from->_internal_metadata_).
           super_InternalMetadataWithArenaBase<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_google::protobuf::internal::InternalMetadataWithArenaLite>
           .ptr_;
  if (((ulong)pvVar1 & 1) != 0) {
    google::protobuf::internal::InternalMetadataWithArenaLite::DoMergeFrom
              (&this->_internal_metadata_,(string *)((ulong)pvVar1 & 0xfffffffffffffffe));
  }
  (this->conditionvar_).ptr_ =
       (string *)&google::protobuf::internal::fixed_address_empty_string_abi_cxx11_;
  value.ptr_ = (from->conditionvar_).ptr_;
  if ((value.ptr_)->_M_string_length != 0) {
    google::protobuf::internal::ArenaStringPtr::AssignWithDefault
              (&this->conditionvar_,
               (string *)&google::protobuf::internal::fixed_address_empty_string_abi_cxx11_,value);
  }
  pNVar2 = from->conditionnetwork_;
  if (pNVar2 == (NeuralNetwork *)0x0 ||
      from == (LoopLayerParams *)&_LoopLayerParams_default_instance_) {
    pNVar3 = (NeuralNetwork *)0x0;
  }
  else {
    pNVar3 = (NeuralNetwork *)operator_new(0x58);
    NeuralNetwork::NeuralNetwork(pNVar3,pNVar2);
  }
  this->conditionnetwork_ = pNVar3;
  pNVar2 = from->bodynetwork_;
  if (pNVar2 == (NeuralNetwork *)0x0 ||
      from == (LoopLayerParams *)&_LoopLayerParams_default_instance_) {
    pNVar3 = (NeuralNetwork *)0x0;
  }
  else {
    pNVar3 = (NeuralNetwork *)operator_new(0x58);
    NeuralNetwork::NeuralNetwork(pNVar3,pNVar2);
  }
  this->bodynetwork_ = pNVar3;
  this->maxloopiterations_ = from->maxloopiterations_;
  return;
}

Assistant:

LoopLayerParams::LoopLayerParams(const LoopLayerParams& from)
  : ::google::protobuf::MessageLite(),
      _internal_metadata_(NULL),
      _cached_size_(0) {
  _internal_metadata_.MergeFrom(from._internal_metadata_);
  conditionvar_.UnsafeSetDefault(&::google::protobuf::internal::GetEmptyStringAlreadyInited());
  if (from.conditionvar().size() > 0) {
    conditionvar_.AssignWithDefault(&::google::protobuf::internal::GetEmptyStringAlreadyInited(), from.conditionvar_);
  }
  if (from.has_conditionnetwork()) {
    conditionnetwork_ = new ::CoreML::Specification::NeuralNetwork(*from.conditionnetwork_);
  } else {
    conditionnetwork_ = NULL;
  }
  if (from.has_bodynetwork()) {
    bodynetwork_ = new ::CoreML::Specification::NeuralNetwork(*from.bodynetwork_);
  } else {
    bodynetwork_ = NULL;
  }
  maxloopiterations_ = from.maxloopiterations_;
  // @@protoc_insertion_point(copy_constructor:CoreML.Specification.LoopLayerParams)
}